

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.h
# Opt level: O3

ComponentPtr __thiscall
Kompositum::buildComposite(Kompositum *this,IDType id,ParentChildTreeDef *treeMap)

{
  _Base_ptr p_Var1;
  undefined8 *puVar2;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  pointer *__ptr;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar6;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_48;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_40;
  IDType local_38;
  
  p_Var1 = (treeMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_38 = id;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var5 = &(treeMap->_M_t)._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var5->_M_header;
    do {
      if (*(ulong *)(p_Var1 + 1) >= id) {
        p_Var4 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < id];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var5) && (*(ulong *)(p_Var4 + 1) <= id)) {
      puVar2 = (undefined8 *)operator_new(0x28);
      puVar2[1] = id;
      *puVar2 = &PTR__Composite_00103cf0;
      puVar2[2] = 0;
      puVar2[3] = 0;
      puVar2[4] = 0;
      pVar6 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::equal_range(&treeMap->_M_t,&local_38);
      _Var3 = pVar6.first._M_node;
      if (_Var3._M_node != pVar6.second._M_node._M_node) {
        local_40._M_head_impl = (Component *)this;
        do {
          buildComposite((Kompositum *)&local_48,(IDType)_Var3._M_node[1]._M_parent,treeMap);
          std::
          vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
          ::
          emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
                    ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
                      *)(puVar2 + 2),
                     (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>
                      *)&local_48);
          if (local_48._M_head_impl != (Component *)0x0) {
            (*(local_48._M_head_impl)->_vptr_Component[1])();
          }
          local_48._M_head_impl = (Component *)0x0;
          _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
          this = (Kompositum *)local_40;
        } while (_Var3._M_node != pVar6.second._M_node._M_node);
      }
      goto LAB_001012e6;
    }
  }
  puVar2 = (undefined8 *)operator_new(0x10);
  puVar2[1] = id;
  *puVar2 = &PTR__Component_00103d98;
LAB_001012e6:
  *(undefined8 **)this = puVar2;
  return (__uniq_ptr_data<Kompositum::Component,_std::default_delete<Kompositum::Component>,_true,_true>
          )(tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)this;
}

Assistant:

ComponentPtr buildComposite(IDType id, const ParentChildTreeDef& treeMap) {
    const bool hasChildren = treeMap.find(id) != treeMap.end();
    if (hasChildren) {
        auto composite = make_unique<Composite>(id);

        auto range = treeMap.equal_range(id);
        for (auto child = range.first; child != range.second; ++child) {
            composite->addChild(buildComposite(child->second, treeMap));
        }

        return std::move(composite);
    }

    return make_unique<Leaf>(id);
}